

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

int __thiscall vec<WatchElem>::remove(vec<WatchElem> *this,char *__filename)

{
  uint extraout_EAX;
  anon_union_8_2_743a5d44_for_WatchElem_0 *paVar1;
  uint j;
  bool local_29;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    local_29 = false;
    if (local_14 < this->sz) {
      local_29 = WatchElem::operator!=
                           (this->data + local_14,
                            (WatchElem)*(anon_union_8_2_743a5d44_for_WatchElem_0 *)__filename);
    }
    if (local_29 == false) break;
    local_14 = local_14 + 1;
  }
  if (local_14 < this->sz) {
    paVar1 = &last(this)->field_0;
    this->data[local_14].field_0 = *paVar1;
    pop(this);
    local_14 = extraout_EAX;
  }
  return local_14;
}

Assistant:

void remove(const T& t) {
		unsigned int j;
		for (j = 0; j < sz && data[j] != t; j++) {
			;
		}
		if (j < sz) {
			data[j] = last();
			pop();
		}
	}